

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calendar.c
# Opt level: O1

int equal_calendar_record(calendar_record_t *a,calendar_record_t *b)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  
  iVar1 = strcmp(a->service_id,b->service_id);
  uVar2 = 0;
  uVar3 = 0;
  if (iVar1 == 0) {
    iVar1 = strcmp(a->start_date,b->start_date);
    if (iVar1 == 0) {
      iVar1 = strcmp(a->end_date,b->end_date);
      if ((((iVar1 == 0) && (uVar2 = uVar3, a->monday == b->monday)) && (a->tuesday == b->tuesday))
         && (((a->wednesday == b->wednesday && (a->thursday == b->thursday)) &&
             ((a->friday == b->friday && (a->saturday == b->saturday)))))) {
        uVar2 = (uint)(a->sunday == b->sunday);
      }
    }
  }
  return uVar2;
}

Assistant:

int equal_calendar_record(const calendar_record_t *a, const calendar_record_t *b) {
    return (!strcmp(a->service_id, b->service_id) &&
             !strcmp(a->start_date, b->start_date) &&
             !strcmp(a->end_date, b->end_date) &&
             a->monday == b->monday &&
             a->tuesday == b->tuesday &&
             a->wednesday == b->wednesday &&
             a->thursday == b->thursday &&
             a->friday == b->friday &&
             a->saturday == b->saturday &&
             a->sunday == b->sunday);
}